

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O2

JointIndex __thiscall
iDynTree::Model::addJointAndLink
          (Model *this,string *existingLink,string *jointName,IJointConstPtr joint,
          string *newLinkName,Link *newLink)

{
  bool bVar1;
  LinkIndex LVar2;
  JointIndex JVar3;
  string error;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)existingLink);
  bVar1 = isLinkNameUsed(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (bVar1) {
    LVar2 = addLink(this,newLinkName,newLink);
    if (LVar2 != LINK_INVALID_INDEX) {
      JVar3 = addJoint(this,existingLink,newLinkName,jointName,joint);
      return JVar3;
    }
    std::operator+(&local_90,"Error adding link of name ",newLinkName);
    iDynTree::reportError("Model","addJointAndLink",local_90._M_dataplus._M_p);
  }
  else {
    std::operator+(&local_70,"a link of name ",existingLink);
    std::operator+(&local_90,&local_70," is not present in the model");
    std::__cxx11::string::~string((string *)&local_70);
    iDynTree::reportError("Model","addJointAndLink",local_90._M_dataplus._M_p);
  }
  JVar3 = JOINT_INVALID_INDEX;
  std::__cxx11::string::~string((string *)&local_90);
  return JVar3;
}

Assistant:

JointIndex Model::addJointAndLink(const std::string& existingLink,
                                  const std::string& jointName, IJointConstPtr joint,
                                  const std::string& newLinkName, Link& newLink)
{
    if( !(this->isLinkNameUsed(existingLink)) )
    {
        std::string error = "a link of name " + existingLink + " is not present in the model";
        reportError("Model","addJointAndLink",error.c_str());
        return JOINT_INVALID_INDEX;
    }

    LinkIndex newAddedLink = this->addLink(newLinkName,newLink);

    if( newAddedLink == LINK_INVALID_INDEX )
    {
        std::string error = "Error adding link of name " + newLinkName;
        reportError("Model","addJointAndLink",error.c_str());
        return JOINT_INVALID_INDEX;
    }

    return this->addJoint(existingLink,newLinkName,
                          jointName,joint);
}